

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_binary_tests.cc
# Opt level: O0

void __thiscall
lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody
          (meshFunctionBinary_Addition_Test *this)

{
  undefined1 *this_00;
  element_type *peVar1;
  test *this_01;
  int in_R9D;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
  a;
  X local_308;
  MeshFunctionConstant<lf::mesh::utils::test::X> local_304;
  Mesh *local_300;
  uint local_2f8;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
  local_2f0;
  Mesh *local_2e0;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
  xSum;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>_>
  local_2c0;
  undefined1 local_298 [8];
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>_>
  matrixSum;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>_>
  local_260;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_238;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>_>
  local_228;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_200;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>_>
  local_1f0;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_1c8;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>_>
  local_1b8;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_190;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>_>
  local_180;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_158;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>_>
  local_148;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_120;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>_>
  local_110;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  local_e8;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>_>
  local_d8;
  undefined1 local_a8 [8];
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
  mfVecAdd;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:99:57)>
  local_90;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>_>
  local_80;
  undefined1 local_48 [8];
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>_>
  sum;
  shared_ptr<lf::mesh::Mesh> mesh;
  meshFunctionBinary_Addition_Test *this_local;
  
  test_utils::GenerateHybrid2DTestMesh((test_utils *)&sum.b_.field_0x8,0,1.0);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>_>
            ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>_>
              *)local_48,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>
              *)mfA,(MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>
                     *)mfB);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:59:24)>_>
  ::MeshFunctionBinary
            (&local_80,
             (MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:59:24)>_>
              *)local_48);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:99:57)>
  ::MeshFunctionGlobal(&local_90);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__1>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__0>>
            (peVar1,&local_80,&local_90,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:99:57)>
  ::~MeshFunctionGlobal(&local_90);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:57:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:59:24)>_>
  ::~MeshFunctionBinary(&local_80);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>_>
            (&local_d8,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
              *)mfVectorA,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>
              *)mfVectorB);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_e8,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__2>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__3>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_d8,&local_e8,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_e8);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:60:37)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:62:5)>_>
  ::~MeshFunctionBinary(&local_d8);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>_>
            (&local_110,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
              *)mfVectorA_dynamic,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:62:5)>
              *)mfVectorB);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_120,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__4>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__3>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_110,&local_120,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_120);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:64:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:62:5)>_>
  ::~MeshFunctionBinary(&local_110);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>_>
            (&local_148,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:60:37)>
              *)mfVectorA,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>
              *)mfVectorB_dynamic);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_158,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__2>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__5>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_148,&local_158,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_158);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:60:37)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:65:45)>_>
  ::~MeshFunctionBinary(&local_148);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>_>
            (&local_180,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:64:5)>
              *)mfVectorA_dynamic,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:65:45)>
              *)mfVectorB_dynamic);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_190,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__4>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__5>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_180,&local_190,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_190);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:64:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:65:45)>_>
  ::~MeshFunctionBinary(&local_180);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>_>
            (&local_1b8,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
              *)mfArrayA,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>
              *)mfArrayB);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_1c8,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__6>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__7>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_1b8,&local_1c8,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_1c8);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:70:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:72:24)>_>
  ::~MeshFunctionBinary(&local_1b8);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>_>
            (&local_1f0,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
              *)mfArrayA_dynamic,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:72:24)>
              *)mfArrayB);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_200,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__8>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__7>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_1f0,&local_200,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_200);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:76:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:72:24)>_>
  ::~MeshFunctionBinary(&local_1f0);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>_>
            (&local_228,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:70:5)>
              *)mfArrayA,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>
              *)mfArrayB_dynamic);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            (&local_238,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__6>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__9>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_228,&local_238,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal(&local_238);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:70:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:78:24)>_>
  ::~MeshFunctionBinary(&local_228);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>_>
            (&local_260,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:76:5)>
              *)mfArrayA_dynamic,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:78:24)>
              *)mfArrayB_dynamic);
  this_00 = &matrixSum.b_.field_0x8;
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)this_00,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)local_a8);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__8>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__9>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__1>>
            (peVar1,&local_260,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)this_00,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:104:7)>
  ::~MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:104:7)>
              *)&matrixSum.b_.field_0x8);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:76:5)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:78:24)>_>
  ::~MeshFunctionBinary(&local_260);
  operator+<lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>_>
            ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>_>
              *)local_298,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>
              *)mfMatrixA,
             (MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>
              *)mfMatrixB);
  peVar1 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&sum.b_.field_0x8);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:84:37)>_>
  ::MeshFunctionBinary
            (&local_2c0,
             (MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:84:37)>_>
              *)local_298);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:116:63)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:116:63)>
              *)&xSum.b_);
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__10>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::__11>>,lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::meshFunctionBinary_Addition_Test::TestBody()::__2>>
            (peVar1,&local_2c0,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:116:63)>
              *)&xSum.b_,0);
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:116:63)>
  ::~MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_mesh_utils_test_mesh_function_binary_tests_cc:116:63)>
              *)&xSum.b_);
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:83:24)>,_lf::mesh::utils::MeshFunctionGlobal<lf::mesh::utils::test::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/test/mesh_function_binary_tests.cc:84:37)>_>
  ::~MeshFunctionBinary(&local_2c0);
  local_2f0 = operator+<lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,_lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>_>
                        ((MeshFunctionConstant<lf::mesh::utils::test::X> *)&mfXA,
                         (MeshFunctionConstant<lf::mesh::utils::test::X> *)&mfXB);
  xSum._0_4_ = local_2f0.b_.value_.x_;
  local_2e0 = local_2f0._0_8_;
  this_01 = (test *)std::
                    __shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator*((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&sum.b_.field_0x8);
  local_2f8 = xSum._0_4_;
  local_300 = local_2e0;
  X::X(&local_308,3);
  MeshFunctionConstant<lf::mesh::utils::test::X>::MeshFunctionConstant(&local_304,local_308);
  a.a_.value_.x_ = (X)0x0;
  a._0_4_ = local_2f8;
  a.b_.value_.x_ = local_304.value_.x_;
  checkMeshFunctionEqual<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorAddition,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>>,lf::mesh::utils::MeshFunctionConstant<lf::mesh::utils::test::X>>
            (this_01,local_300,a,(MeshFunctionConstant<lf::mesh::utils::test::X>)0x0,in_R9D);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr((shared_ptr<lf::mesh::Mesh> *)&sum.b_.field_0x8);
  return;
}

Assistant:

TEST(meshFunctionBinary, Addition) {
  auto mesh = lf::mesh::test_utils::GenerateHybrid2DTestMesh(0);

  auto sum = mfA + mfB;
  checkMeshFunctionEqual(*mesh, sum, MeshFunctionGlobal([](auto x) {
    return x[0] * x[0] + 2 * x[1] + x[0];
  }));

  auto mfVecAdd = MeshFunctionGlobal(
      [](auto x) { return Eigen::Vector2d(2 * x[0], x[1] + 2 * x[0]); });
  checkMeshFunctionEqual(*mesh, mfVectorA + mfVectorB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfVectorA_dynamic + mfVectorB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfVectorA + mfVectorB_dynamic, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfVectorA_dynamic + mfVectorB_dynamic,
                         mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA + mfArrayB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA_dynamic + mfArrayB, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA + mfArrayB_dynamic, mfVecAdd);
  checkMeshFunctionEqual(*mesh, mfArrayA_dynamic + mfArrayB_dynamic, mfVecAdd);

  auto matrixSum = mfMatrixA + mfMatrixB;
  checkMeshFunctionEqual(*mesh, matrixSum, MeshFunctionGlobal([](auto x) {
    return (Eigen::Matrix2d() << x[0] * x[0], 1 + x[0] * x[1],
            x[0] * x[1] + x[0], x[1] * x[1] + x[1])
        .finished();
  }));

  auto xSum = mfXA + mfXB;
  checkMeshFunctionEqual(*mesh, xSum, MeshFunctionConstant(X(3)));
}